

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O2

int is_mode_coeff_dv_upd_freq_tile_or_off(AV1_COMP *cpi)

{
  uint uVar1;
  
  uVar1 = 0;
  if (((cpi->sf).inter_sf.coeff_cost_upd_level < INTERNAL_COST_UPD_SBROW_SET) &&
     ((cpi->sf).inter_sf.mode_cost_upd_level < INTERNAL_COST_UPD_SBROW_SET)) {
    uVar1 = (uint)((cpi->sf).intra_sf.dv_cost_upd_level < INTERNAL_COST_UPD_SBROW_SET);
  }
  return uVar1;
}

Assistant:

static inline int is_mode_coeff_dv_upd_freq_tile_or_off(
    const AV1_COMP *const cpi) {
  const INTER_MODE_SPEED_FEATURES *const inter_sf = &cpi->sf.inter_sf;

  return (inter_sf->coeff_cost_upd_level <= INTERNAL_COST_UPD_TILE &&
          inter_sf->mode_cost_upd_level <= INTERNAL_COST_UPD_TILE &&
          cpi->sf.intra_sf.dv_cost_upd_level <= INTERNAL_COST_UPD_TILE);
}